

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_http_client_async.cpp
# Opt level: O1

void __thiscall Client::Client(Client *this,io_context *io_context,string *host,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  context *this_00;
  pointer pcVar3;
  value_type *__val;
  pointer __s;
  ostream *poVar4;
  error_code ec;
  results_type endpoints;
  resolver resolver;
  default_connect_condition local_e9;
  string local_e8;
  error_code local_c8;
  streambuf *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  string *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  results_type local_98;
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  *local_80;
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  local_78;
  
  this->io_context_ = io_context;
  paVar1 = &(this->host_).field_2;
  (this->host_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (host->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->host_,pcVar3,pcVar3 + host->_M_string_length);
  paVar2 = &(this->path_).field_2;
  (this->path_)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (path->_M_dataplus)._M_p;
  local_a0 = paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->path_,pcVar3,pcVar3 + path->_M_string_length);
  this_00 = &this->ssl_context_;
  local_b0 = paVar2;
  local_a8 = &this->path_;
  boost::asio::ssl::context::context(this_00,sslv23);
  boost::asio::ssl::
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::stream<boost::asio::io_context&>
            ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
              *)&this->ssl_socket_,this->io_context_,this_00);
  boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (&this->request_,0xffffffffffffffff,(allocator<char> *)&local_78);
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8 = &this->request_;
  __s = (pointer)operator_new(0x400);
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = __s;
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = __s;
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __s + 0x400;
  memset(__s,0,0x400);
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = __s + 0x400;
  boost::asio::ssl::context::set_default_verify_paths(this_00);
  boost::system::error_code::error_code(&local_c8);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>(&local_78,this->io_context_,(type *)0x0);
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"https","");
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::resolve(&local_98,
            (basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             *)&local_78,&this->host_,&local_e8,0,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (local_c8.failed_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Resolve failed: ",0x10);
    (*(local_c8.cat_)->_vptr_error_category[4])(&local_e8,local_c8.cat_,(ulong)(uint)local_c8.val_);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_e8._M_dataplus._M_p,local_e8._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
  }
  else {
    local_e8._M_dataplus._M_p = (pointer)ConnectHandler;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_allocated_capacity = (size_type)this;
    local_80 = &this->ssl_socket_;
    boost::asio::detail::
    initiate_async_range_connect<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
    ::operator()((initiate_async_range_connect<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                  *)&local_80,
                 (_Bind<void_(Client::*(Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(boost::system::error_code,_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>)>
                  *)&local_e8,&local_98,&local_e9);
  }
  if (local_98.super_basic_resolver_iterator<boost::asio::ip::tcp>.values_.
      super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super_basic_resolver_iterator<boost::asio::ip::tcp>.values_.
               super___shared_ptr<std::vector<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&local_78);
  return;
}

Assistant:

Client::Client(boost::asio::io_context& io_context,
               const std::string& host, const std::string& path)
    : io_context_(io_context),
      host_(host), path_(path),
      ssl_context_(ssl::context::sslv23),
      ssl_socket_(io_context_, ssl_context_),
      buffer_(1024) {

  // Use the default paths for finding CA certificates.
  ssl_context_.set_default_verify_paths();

  boost::system::error_code ec;

  // Get a list of endpoints corresponding to the server name.
  tcp::resolver resolver(io_context_);
  auto endpoints = resolver.resolve(host_, "https", ec);

  if (ec) {
    std::cerr << "Resolve failed: " << ec.message() << std::endl;
    return;
  }

  // ConnectHandler: void (boost::system::error_code, tcp::endpoint)
  boost::asio::async_connect(ssl_socket_.lowest_layer(), endpoints,
                             std::bind(&Client::ConnectHandler, this,
                                       std::placeholders::_1,
                                       std::placeholders::_2));
}